

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SceneCombiner.cpp
# Opt level: O0

void Assimp::SceneCombiner::Copy(aiMesh **_dest,aiMesh *src)

{
  bool bVar1;
  aiMesh *this;
  aiFace *f;
  uint i;
  uint n;
  aiMesh *dest;
  aiMesh *src_local;
  aiMesh **_dest_local;
  
  if ((_dest != (aiMesh **)0x0) && (src != (aiMesh *)0x0)) {
    this = (aiMesh *)operator_new(0x520);
    aiMesh::aiMesh(this);
    *_dest = this;
    memcpy(this,src,0x520);
    GetArrayCopy<aiVector3t<float>>(&this->mVertices,this->mNumVertices);
    GetArrayCopy<aiVector3t<float>>(&this->mNormals,this->mNumVertices);
    GetArrayCopy<aiVector3t<float>>(&this->mTangents,this->mNumVertices);
    GetArrayCopy<aiVector3t<float>>(&this->mBitangents,this->mNumVertices);
    f._4_4_ = 0;
    while (bVar1 = aiMesh::HasTextureCoords(this,f._4_4_), bVar1) {
      GetArrayCopy<aiVector3t<float>>(this->mTextureCoords + f._4_4_,this->mNumVertices);
      f._4_4_ = f._4_4_ + 1;
    }
    f._4_4_ = 0;
    while (bVar1 = aiMesh::HasVertexColors(this,f._4_4_), bVar1) {
      GetArrayCopy<aiColor4t<float>>(this->mColors + f._4_4_,this->mNumVertices);
      f._4_4_ = f._4_4_ + 1;
    }
    CopyPtrArray<aiBone>(&this->mBones,this->mBones,this->mNumBones);
    GetArrayCopy<aiFace>(&this->mFaces,this->mNumFaces);
    for (f._0_4_ = 0; (uint)f < this->mNumFaces; f._0_4_ = (uint)f + 1) {
      GetArrayCopy<unsigned_int>(&this->mFaces[(uint)f].mIndices,this->mFaces[(uint)f].mNumIndices);
    }
    CopyPtrArray<aiAnimMesh>(&this->mAnimMeshes,this->mAnimMeshes,this->mNumAnimMeshes);
  }
  return;
}

Assistant:

void SceneCombiner::Copy( aiMesh** _dest, const aiMesh* src ) {
    if ( nullptr == _dest || nullptr == src ) {
        return;
    }

    aiMesh* dest = *_dest = new aiMesh();

    // get a flat copy
    ::memcpy(dest,src,sizeof(aiMesh));

    // and reallocate all arrays
    GetArrayCopy( dest->mVertices,   dest->mNumVertices );
    GetArrayCopy( dest->mNormals ,   dest->mNumVertices );
    GetArrayCopy( dest->mTangents,   dest->mNumVertices );
    GetArrayCopy( dest->mBitangents, dest->mNumVertices );

    unsigned int n = 0;
    while (dest->HasTextureCoords(n))
        GetArrayCopy( dest->mTextureCoords[n++],   dest->mNumVertices );

    n = 0;
    while (dest->HasVertexColors(n))
        GetArrayCopy( dest->mColors[n++],   dest->mNumVertices );

    // make a deep copy of all bones
    CopyPtrArray(dest->mBones,dest->mBones,dest->mNumBones);

    // make a deep copy of all faces
    GetArrayCopy(dest->mFaces,dest->mNumFaces);
    for (unsigned int i = 0; i < dest->mNumFaces;++i) {
        aiFace& f = dest->mFaces[i];
        GetArrayCopy(f.mIndices,f.mNumIndices);
    }

    // make a deep copy of all blend shapes
    CopyPtrArray(dest->mAnimMeshes, dest->mAnimMeshes, dest->mNumAnimMeshes);
}